

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPlatform.cpp
# Opt level: O3

void __thiscall
vk::InstanceDriver::InstanceDriver
          (InstanceDriver *this,PlatformInterface *platformInterface,VkInstance instance)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  
  (this->super_InstanceInterface)._vptr_InstanceInterface =
       (_func_int **)&PTR_destroyInstance_00272dd8;
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkDestroyInstance");
  (this->m_vk).destroyInstance = (DestroyInstanceFunc)CONCAT44(extraout_var,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkEnumeratePhysicalDevices");
  (this->m_vk).enumeratePhysicalDevices =
       (EnumeratePhysicalDevicesFunc)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceFeatures");
  (this->m_vk).getPhysicalDeviceFeatures =
       (GetPhysicalDeviceFeaturesFunc)CONCAT44(extraout_var_01,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceFormatProperties");
  (this->m_vk).getPhysicalDeviceFormatProperties =
       (GetPhysicalDeviceFormatPropertiesFunc)CONCAT44(extraout_var_02,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceImageFormatProperties");
  (this->m_vk).getPhysicalDeviceImageFormatProperties =
       (GetPhysicalDeviceImageFormatPropertiesFunc)CONCAT44(extraout_var_03,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceProperties");
  (this->m_vk).getPhysicalDeviceProperties =
       (GetPhysicalDevicePropertiesFunc)CONCAT44(extraout_var_04,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceQueueFamilyProperties");
  (this->m_vk).getPhysicalDeviceQueueFamilyProperties =
       (GetPhysicalDeviceQueueFamilyPropertiesFunc)CONCAT44(extraout_var_05,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceMemoryProperties");
  (this->m_vk).getPhysicalDeviceMemoryProperties =
       (GetPhysicalDeviceMemoryPropertiesFunc)CONCAT44(extraout_var_06,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetDeviceProcAddr");
  (this->m_vk).getDeviceProcAddr = (GetDeviceProcAddrFunc)CONCAT44(extraout_var_07,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkCreateDevice");
  (this->m_vk).createDevice = (CreateDeviceFunc)CONCAT44(extraout_var_08,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkEnumerateDeviceExtensionProperties");
  (this->m_vk).enumerateDeviceExtensionProperties =
       (EnumerateDeviceExtensionPropertiesFunc)CONCAT44(extraout_var_09,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkEnumerateDeviceLayerProperties");
  (this->m_vk).enumerateDeviceLayerProperties =
       (EnumerateDeviceLayerPropertiesFunc)CONCAT44(extraout_var_10,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceSparseImageFormatProperties");
  (this->m_vk).getPhysicalDeviceSparseImageFormatProperties =
       (GetPhysicalDeviceSparseImageFormatPropertiesFunc)CONCAT44(extraout_var_11,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkDestroySurfaceKHR");
  (this->m_vk).destroySurfaceKHR = (DestroySurfaceKHRFunc)CONCAT44(extraout_var_12,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceSurfaceSupportKHR");
  (this->m_vk).getPhysicalDeviceSurfaceSupportKHR =
       (GetPhysicalDeviceSurfaceSupportKHRFunc)CONCAT44(extraout_var_13,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceSurfaceCapabilitiesKHR");
  (this->m_vk).getPhysicalDeviceSurfaceCapabilitiesKHR =
       (GetPhysicalDeviceSurfaceCapabilitiesKHRFunc)CONCAT44(extraout_var_14,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceSurfaceFormatsKHR");
  (this->m_vk).getPhysicalDeviceSurfaceFormatsKHR =
       (GetPhysicalDeviceSurfaceFormatsKHRFunc)CONCAT44(extraout_var_15,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceSurfacePresentModesKHR");
  (this->m_vk).getPhysicalDeviceSurfacePresentModesKHR =
       (GetPhysicalDeviceSurfacePresentModesKHRFunc)CONCAT44(extraout_var_16,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceDisplayPropertiesKHR");
  (this->m_vk).getPhysicalDeviceDisplayPropertiesKHR =
       (GetPhysicalDeviceDisplayPropertiesKHRFunc)CONCAT44(extraout_var_17,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceDisplayPlanePropertiesKHR");
  (this->m_vk).getPhysicalDeviceDisplayPlanePropertiesKHR =
       (GetPhysicalDeviceDisplayPlanePropertiesKHRFunc)CONCAT44(extraout_var_18,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetDisplayPlaneSupportedDisplaysKHR");
  (this->m_vk).getDisplayPlaneSupportedDisplaysKHR =
       (GetDisplayPlaneSupportedDisplaysKHRFunc)CONCAT44(extraout_var_19,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetDisplayModePropertiesKHR");
  (this->m_vk).getDisplayModePropertiesKHR =
       (GetDisplayModePropertiesKHRFunc)CONCAT44(extraout_var_20,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkCreateDisplayModeKHR");
  (this->m_vk).createDisplayModeKHR = (CreateDisplayModeKHRFunc)CONCAT44(extraout_var_21,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetDisplayPlaneCapabilitiesKHR");
  (this->m_vk).getDisplayPlaneCapabilitiesKHR =
       (GetDisplayPlaneCapabilitiesKHRFunc)CONCAT44(extraout_var_22,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkCreateDisplayPlaneSurfaceKHR");
  (this->m_vk).createDisplayPlaneSurfaceKHR =
       (CreateDisplayPlaneSurfaceKHRFunc)CONCAT44(extraout_var_23,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkCreateXlibSurfaceKHR");
  (this->m_vk).createXlibSurfaceKHR = (CreateXlibSurfaceKHRFunc)CONCAT44(extraout_var_24,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceXlibPresentationSupportKHR");
  (this->m_vk).getPhysicalDeviceXlibPresentationSupportKHR =
       (GetPhysicalDeviceXlibPresentationSupportKHRFunc)CONCAT44(extraout_var_25,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkCreateXcbSurfaceKHR");
  (this->m_vk).createXcbSurfaceKHR = (CreateXcbSurfaceKHRFunc)CONCAT44(extraout_var_26,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceXcbPresentationSupportKHR");
  (this->m_vk).getPhysicalDeviceXcbPresentationSupportKHR =
       (GetPhysicalDeviceXcbPresentationSupportKHRFunc)CONCAT44(extraout_var_27,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkCreateWaylandSurfaceKHR");
  (this->m_vk).createWaylandSurfaceKHR =
       (CreateWaylandSurfaceKHRFunc)CONCAT44(extraout_var_28,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceWaylandPresentationSupportKHR");
  (this->m_vk).getPhysicalDeviceWaylandPresentationSupportKHR =
       (GetPhysicalDeviceWaylandPresentationSupportKHRFunc)CONCAT44(extraout_var_29,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkCreateMirSurfaceKHR");
  (this->m_vk).createMirSurfaceKHR = (CreateMirSurfaceKHRFunc)CONCAT44(extraout_var_30,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceMirPresentationSupportKHR");
  (this->m_vk).getPhysicalDeviceMirPresentationSupportKHR =
       (GetPhysicalDeviceMirPresentationSupportKHRFunc)CONCAT44(extraout_var_31,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkCreateAndroidSurfaceKHR");
  (this->m_vk).createAndroidSurfaceKHR =
       (CreateAndroidSurfaceKHRFunc)CONCAT44(extraout_var_32,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkCreateWin32SurfaceKHR");
  (this->m_vk).createWin32SurfaceKHR = (CreateWin32SurfaceKHRFunc)CONCAT44(extraout_var_33,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceWin32PresentationSupportKHR");
  (this->m_vk).getPhysicalDeviceWin32PresentationSupportKHR =
       (GetPhysicalDeviceWin32PresentationSupportKHRFunc)CONCAT44(extraout_var_34,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceFeatures2KHR");
  (this->m_vk).getPhysicalDeviceFeatures2KHR =
       (GetPhysicalDeviceFeatures2KHRFunc)CONCAT44(extraout_var_35,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceProperties2KHR");
  (this->m_vk).getPhysicalDeviceProperties2KHR =
       (GetPhysicalDeviceProperties2KHRFunc)CONCAT44(extraout_var_36,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceFormatProperties2KHR");
  (this->m_vk).getPhysicalDeviceFormatProperties2KHR =
       (GetPhysicalDeviceFormatProperties2KHRFunc)CONCAT44(extraout_var_37,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceImageFormatProperties2KHR");
  (this->m_vk).getPhysicalDeviceImageFormatProperties2KHR =
       (GetPhysicalDeviceImageFormatProperties2KHRFunc)CONCAT44(extraout_var_38,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceQueueFamilyProperties2KHR");
  (this->m_vk).getPhysicalDeviceQueueFamilyProperties2KHR =
       (GetPhysicalDeviceQueueFamilyProperties2KHRFunc)CONCAT44(extraout_var_39,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceMemoryProperties2KHR");
  (this->m_vk).getPhysicalDeviceMemoryProperties2KHR =
       (GetPhysicalDeviceMemoryProperties2KHRFunc)CONCAT44(extraout_var_40,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceSparseImageFormatProperties2KHR"
                    );
  (this->m_vk).getPhysicalDeviceSparseImageFormatProperties2KHR =
       (GetPhysicalDeviceSparseImageFormatProperties2KHRFunc)CONCAT44(extraout_var_41,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkCreateDebugReportCallbackEXT");
  (this->m_vk).createDebugReportCallbackEXT =
       (CreateDebugReportCallbackEXTFunc)CONCAT44(extraout_var_42,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkDestroyDebugReportCallbackEXT");
  (this->m_vk).destroyDebugReportCallbackEXT =
       (DestroyDebugReportCallbackEXTFunc)CONCAT44(extraout_var_43,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkDebugReportMessageEXT");
  (this->m_vk).debugReportMessageEXT = (DebugReportMessageEXTFunc)CONCAT44(extraout_var_44,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceExternalImageFormatPropertiesNV"
                    );
  (this->m_vk).getPhysicalDeviceExternalImageFormatPropertiesNV =
       (GetPhysicalDeviceExternalImageFormatPropertiesNVFunc)CONCAT44(extraout_var_45,iVar1);
  iVar1 = (*platformInterface->_vptr_PlatformInterface[1])
                    (platformInterface,instance,"vkGetPhysicalDeviceGeneratedCommandsPropertiesNVX")
  ;
  (this->m_vk).getPhysicalDeviceGeneratedCommandsPropertiesNVX =
       (GetPhysicalDeviceGeneratedCommandsPropertiesNVXFunc)CONCAT44(extraout_var_46,iVar1);
  return;
}

Assistant:

InstanceDriver::InstanceDriver (const PlatformInterface& platformInterface, VkInstance instance)
{
#define GET_PROC_ADDR(NAME) platformInterface.getInstanceProcAddr(instance, NAME)
#include "vkInitInstanceFunctionPointers.inl"
#undef GET_PROC_ADDR
}